

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O0

int luaopen_base(lua_State *L)

{
  lua_State *L_local;
  
  lua_rawgeti(L,-0xf4628,2);
  luaL_setfuncs(L,base_funcs,0);
  lua_pushvalue(L,-1);
  lua_setfield(L,-2,"_G");
  lua_pushstring(L,"Lua 5.5");
  lua_setfield(L,-2,"_VERSION");
  return 1;
}

Assistant:

LUAMOD_API int luaopen_base (lua_State *L) {
  /* open lib into global table */
  lua_pushglobaltable(L);
  luaL_setfuncs(L, base_funcs, 0);
  /* set global _G */
  lua_pushvalue(L, -1);
  lua_setfield(L, -2, LUA_GNAME);
  /* set global _VERSION */
  lua_pushliteral(L, LUA_VERSION);
  lua_setfield(L, -2, "_VERSION");
  return 1;
}